

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O3

int secp256k1_ec_seckey_tweak_mul(secp256k1_context *ctx,uchar *seckey,uchar *tweak32)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  long lVar5;
  uint uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  int overflow;
  int overflow_1;
  secp256k1_scalar factor;
  int local_80;
  uint local_7c;
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  secp256k1_scalar local_58;
  
  local_80 = 0;
  if (seckey == (uchar *)0x0) {
    secp256k1_ec_seckey_tweak_mul_cold_2();
  }
  else {
    if (tweak32 != (uchar *)0x0) {
      secp256k1_scalar_set_b32(&local_58,tweak32,&local_80);
      secp256k1_scalar_set_b32((secp256k1_scalar *)local_78,seckey,(int *)&local_7c);
      bVar3 = local_78._8_8_ != 0;
      bVar4 = local_68._8_8_ != 0;
      bVar1 = local_78._0_8_ != 0;
      bVar2 = local_68._0_8_ != 0;
      bVar7 = local_80 == 0;
      secp256k1_scalar_mul((secp256k1_scalar *)local_78,(secp256k1_scalar *)local_78,&local_58);
      uVar6 = (uint)((((local_58.d[1] != 0 || local_58.d[3] != 0) ||
                      (local_58.d[0] != 0 || local_58.d[2] != 0)) && bVar7) &&
                    (((bVar3 || bVar4) || (bVar1 || bVar2)) && local_7c == 0));
      local_7c = uVar6 ^ 1;
      lVar5 = (long)(int)local_7c + -1;
      auVar8._8_4_ = (int)lVar5;
      auVar8._0_8_ = lVar5;
      auVar8._12_4_ = (int)((ulong)lVar5 >> 0x20);
      local_78 = local_78 & auVar8;
      local_68 = auVar8 & local_68;
      secp256k1_scalar_get_b32(seckey,(secp256k1_scalar *)local_78);
      return uVar6;
    }
    secp256k1_ec_seckey_tweak_mul_cold_1();
  }
  return 0;
}

Assistant:

int secp256k1_ec_seckey_tweak_mul(const secp256k1_context* ctx, unsigned char *seckey, const unsigned char *tweak32) {
    secp256k1_scalar factor;
    secp256k1_scalar sec;
    int ret = 0;
    int overflow = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(seckey != NULL);
    ARG_CHECK(tweak32 != NULL);

    secp256k1_scalar_set_b32(&factor, tweak32, &overflow);
    ret = secp256k1_scalar_set_b32_seckey(&sec, seckey);
    ret &= (!overflow) & secp256k1_eckey_privkey_tweak_mul(&sec, &factor);
    secp256k1_scalar_cmov(&sec, &secp256k1_scalar_zero, !ret);
    secp256k1_scalar_get_b32(seckey, &sec);

    secp256k1_scalar_clear(&sec);
    secp256k1_scalar_clear(&factor);
    return ret;
}